

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
fmt::v8::to_string<char,500ul>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,v8 *this,basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  allocator local_55 [13];
  string local_48 [32];
  size_t local_28;
  size_t size;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf_local;
  undefined1 local_9;
  
  size = (size_t)this;
  buf_local = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)__return_storage_ptr__;
  sVar1 = detail::buffer<char>::size((buffer<char> *)this);
  local_28 = sVar1;
  std::__cxx11::string::string(local_48);
  uVar2 = std::__cxx11::string::max_size();
  local_9 = sVar1 < uVar2;
  std::__cxx11::string::~string(local_48);
  pcVar3 = detail::buffer<char>::data((buffer<char> *)size);
  sVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,sVar1,local_55);
  std::allocator<char>::~allocator((allocator<char> *)local_55);
  return __return_storage_ptr__;
}

Assistant:

auto to_string(const basic_memory_buffer<Char, SIZE>& buf)
    -> std::basic_string<Char> {
  auto size = buf.size();
  detail::assume(size < std::basic_string<Char>().max_size());
  return std::basic_string<Char>(buf.data(), size);
}